

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_proxy_constructor(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue val;
  JSValue val_00;
  int iVar1;
  JSValueUnion *opaque;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar2;
  JSValue JVar3;
  JSProxyData *s;
  JSValue obj;
  JSValue handler;
  JSValue target;
  JSContext *in_stack_ffffffffffffff40;
  JSValueUnion *pJVar4;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar5;
  JSClassID in_stack_ffffffffffffff4c;
  undefined4 uVar6;
  JSContext *in_stack_ffffffffffffff50;
  JSValueUnion in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  JSValueUnion local_98;
  JSValueUnion local_10;
  int64_t local_8;
  
  val_00 = *in_R8;
  val = *in_R8;
  JVar3 = *in_R8;
  v = in_R8[1];
  if (((int)in_R8->tag == -1) && ((int)in_R8[1].tag == -1)) {
    JVar2.tag = in_stack_ffffffffffffff60;
    JVar2.u.ptr = in_stack_ffffffffffffff58.ptr;
    JVar2 = JS_NewObjectProtoClass(in_stack_ffffffffffffff50,JVar2,in_stack_ffffffffffffff4c);
    iVar1 = JS_IsException(JVar2);
    if (iVar1 == 0) {
      opaque = (JSValueUnion *)
               js_malloc((JSContext *)in_stack_ffffffffffffff58.ptr,
                         (size_t)in_stack_ffffffffffffff50);
      if (opaque == (JSValueUnion *)0x0) {
        JVar3.u._4_4_ = in_stack_ffffffffffffff4c;
        JVar3.u.int32 = in_stack_ffffffffffffff48;
        JVar3.tag = (int64_t)in_stack_ffffffffffffff50;
        JS_FreeValue(in_stack_ffffffffffffff40,JVar3);
        local_10.ptr = (void *)(local_10 << 0x20);
        local_8 = 6;
        JVar2 = _local_10;
      }
      else {
        JVar3 = JS_DupValue(in_RDI,JVar3);
        local_98 = (JSValueUnion)JVar3.tag;
        *opaque = JVar3.u;
        opaque[1] = local_98;
        pJVar4 = opaque;
        JVar3 = JS_DupValue(in_RDI,v);
        pJVar4[2] = JVar3.u;
        pJVar4[3] = (JSValueUnion)JVar3.tag;
        iVar1 = JS_IsFunction(in_RDI,val);
        *(char *)(opaque + 4) = (char)iVar1;
        *(undefined1 *)((long)opaque + 0x21) = 0;
        JS_SetOpaque(JVar2,opaque);
        uVar5 = SUB84(in_RDI,0);
        uVar6 = (undefined4)((ulong)in_RDI >> 0x20);
        iVar1 = JS_IsConstructor(in_RDI,val_00);
        JS_SetConstructorBit((JSContext *)CONCAT44(uVar6,uVar5),JVar2,iVar1);
      }
    }
  }
  else {
    JVar2 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x14afcb);
  }
  _local_10 = JVar2;
  return _local_10;
}

Assistant:

static JSValue js_proxy_constructor(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst target, handler;
    JSValue obj;
    JSProxyData *s;

    target = argv[0];
    handler = argv[1];
    if (JS_VALUE_GET_TAG(target) != JS_TAG_OBJECT ||
        JS_VALUE_GET_TAG(handler) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);

    obj = JS_NewObjectProtoClass(ctx, JS_NULL, JS_CLASS_PROXY);
    if (JS_IsException(obj))
        return obj;
    s = js_malloc(ctx, sizeof(JSProxyData));
    if (!s) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    s->target = JS_DupValue(ctx, target);
    s->handler = JS_DupValue(ctx, handler);
    s->is_func = JS_IsFunction(ctx, target);
    s->is_revoked = FALSE;
    JS_SetOpaque(obj, s);
    JS_SetConstructorBit(ctx, obj, JS_IsConstructor(ctx, target));
    return obj;
}